

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O2

int TIFFFlushData1(TIFF *tif)

{
  uint uVar1;
  int iVar2;
  long n;
  uint32_t *puVar3;
  
  n = tif->tif_rawcc;
  if ((n < 1) || (uVar1 = tif->tif_flags, (uVar1 >> 0x14 & 1) == 0)) {
    iVar2 = 1;
  }
  else {
    if ((uVar1 & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
      TIFFReverseBits(tif->tif_rawdata,n);
      uVar1 = tif->tif_flags;
      n = tif->tif_rawcc;
    }
    puVar3 = &tif->tif_curtile;
    if ((uVar1 >> 10 & 1) == 0) {
      puVar3 = &tif->tif_curstrip;
    }
    iVar2 = TIFFAppendToStrip(tif,*puVar3,tif->tif_rawdata,n);
    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;
  }
  return iVar2;
}

Assistant:

int TIFFFlushData1(TIFF *tif)
{
    if (tif->tif_rawcc > 0 && tif->tif_flags & TIFF_BUF4WRITE)
    {
        if (!isFillOrder(tif, tif->tif_dir.td_fillorder) &&
            (tif->tif_flags & TIFF_NOBITREV) == 0)
            TIFFReverseBits((uint8_t *)tif->tif_rawdata, tif->tif_rawcc);
        if (!TIFFAppendToStrip(
                tif, isTiled(tif) ? tif->tif_curtile : tif->tif_curstrip,
                tif->tif_rawdata, tif->tif_rawcc))
        {
            /* We update those variables even in case of error since there's */
            /* code that doesn't really check the return code of this */
            /* function */
            tif->tif_rawcc = 0;
            tif->tif_rawcp = tif->tif_rawdata;
            return (0);
        }
        tif->tif_rawcc = 0;
        tif->tif_rawcp = tif->tif_rawdata;
    }
    return (1);
}